

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O1

int Fraig_MappingUpdateLevel_rec(Fraig_Man_t *pMan,Fraig_Node_t *pNode,int fMaximum)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Fraig_Node_t *pFVar4;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigUtil.c"
                  ,0x1c5,"int Fraig_MappingUpdateLevel_rec(Fraig_Man_t *, Fraig_Node_t *, int)");
  }
  iVar2 = Fraig_NodeIsAnd(pNode);
  if ((iVar2 == 0) || (pNode->TravId == pMan->nTravIds)) goto LAB_005ed334;
  pNode->TravId = pMan->nTravIds;
  iVar3 = Fraig_MappingUpdateLevel_rec
                    (pMan,(Fraig_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe),fMaximum);
  iVar2 = Fraig_MappingUpdateLevel_rec
                    (pMan,(Fraig_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe),fMaximum);
  if (iVar2 < iVar3) {
    iVar2 = iVar3;
  }
  piVar1 = &pNode->Level;
  pNode->Level = iVar2 + 1;
  if (pNode->pNextE == (Fraig_Node_t *)0x0) goto LAB_005ed334;
  iVar2 = Fraig_MappingUpdateLevel_rec(pMan,pNode->pNextE,fMaximum);
  if (fMaximum == 0) {
    if (iVar2 < *piVar1) goto LAB_005ed39a;
  }
  else if (*piVar1 < iVar2) {
LAB_005ed39a:
    *piVar1 = iVar2;
  }
  if (pNode->pRepr == (Fraig_Node_t *)0x0) {
    for (pFVar4 = pNode->pNextE; pFVar4 != (Fraig_Node_t *)0x0; pFVar4 = pFVar4->pNextE) {
      pFVar4->Level = *piVar1;
    }
  }
LAB_005ed334:
  return pNode->Level;
}

Assistant:

int Fraig_MappingUpdateLevel_rec( Fraig_Man_t * pMan, Fraig_Node_t * pNode, int fMaximum )
{
    Fraig_Node_t * pTemp;
    int Level1, Level2, LevelE;
    assert( !Fraig_IsComplement(pNode) );
    if ( !Fraig_NodeIsAnd(pNode) )
        return pNode->Level;
    // skip the visited node
    if ( pNode->TravId == pMan->nTravIds )
        return pNode->Level;
    pNode->TravId = pMan->nTravIds;
    // compute levels of the children nodes
    Level1 = Fraig_MappingUpdateLevel_rec( pMan, Fraig_Regular(pNode->p1), fMaximum );
    Level2 = Fraig_MappingUpdateLevel_rec( pMan, Fraig_Regular(pNode->p2), fMaximum );
    pNode->Level = 1 + Abc_MaxInt( Level1, Level2 );
    if ( pNode->pNextE )
    {
        LevelE = Fraig_MappingUpdateLevel_rec( pMan, pNode->pNextE, fMaximum );
        if ( fMaximum )
        {
            if ( pNode->Level < LevelE )
                pNode->Level = LevelE;
        }
        else
        {
            if ( pNode->Level > LevelE )
                pNode->Level = LevelE;
        }
        // set the level of all equivalent nodes to be the same minimum
        if ( pNode->pRepr == NULL ) // the primary node
            for ( pTemp = pNode->pNextE; pTemp; pTemp = pTemp->pNextE )
                pTemp->Level = pNode->Level;
    }
    return pNode->Level;
}